

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniset_props.cpp
# Opt level: O0

void __thiscall
icu_63::UnicodeSet::UnicodeSet(UnicodeSet *this,UnicodeString *pattern,UErrorCode *status)

{
  UBool UVar1;
  UChar32 *pUVar2;
  UErrorCode *status_local;
  UnicodeString *pattern_local;
  UnicodeSet *this_local;
  
  UnicodeFilter::UnicodeFilter(&this->super_UnicodeFilter);
  (this->super_UnicodeFilter).super_UnicodeFunctor.super_UObject._vptr_UObject =
       (_func_int **)&PTR__UnicodeSet_004b80e0;
  (this->super_UnicodeFilter).super_UnicodeMatcher._vptr_UnicodeMatcher =
       (_func_int **)&PTR__UnicodeSet_004b81f8;
  this->len = 0;
  this->capacity = 0x10;
  this->list = (UChar32 *)0x0;
  this->bmpSet = (BMPSet *)0x0;
  this->buffer = (UChar32 *)0x0;
  this->bufferCapacity = 0;
  this->patLen = 0;
  this->pat = (char16_t *)0x0;
  this->strings = (UVector *)0x0;
  this->stringSpan = (UnicodeSetStringSpan *)0x0;
  this->fFlags = '\0';
  UVar1 = ::U_SUCCESS(*status);
  if (UVar1 != '\0') {
    pUVar2 = (UChar32 *)uprv_malloc_63((long)this->capacity << 2);
    this->list = pUVar2;
    if (this->list == (UChar32 *)0x0) {
      *status = U_MEMORY_ALLOCATION_ERROR;
    }
    else {
      allocateStrings(this,status);
      applyPattern(this,pattern,status);
    }
  }
  return;
}

Assistant:

UnicodeSet::UnicodeSet(const UnicodeString& pattern,
                       UErrorCode& status) :
    len(0), capacity(START_EXTRA), list(0), bmpSet(0), buffer(0),
    bufferCapacity(0), patLen(0), pat(NULL), strings(NULL), stringSpan(NULL),
    fFlags(0)
{
    if(U_SUCCESS(status)){
        list = (UChar32*) uprv_malloc(sizeof(UChar32) * capacity);
        /* test for NULL */
        if(list == NULL) {
            status = U_MEMORY_ALLOCATION_ERROR;  
        }else{
            allocateStrings(status);
            applyPattern(pattern, status);
        }
    }
    _dbgct(this);
}